

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O3

void __thiscall SQFuncState::DiscardTarget(SQFuncState *this)

{
  size_type sVar1;
  SQInstruction *pSVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar3 = PopTarget(this);
  sVar1 = (this->_instructions)._size;
  if ((sVar1 != 0) && (this->_optimization == true)) {
    uVar4 = sVar1 - 1;
    pSVar2 = (this->_instructions)._vals;
    uVar5 = pSVar2[uVar4].op - 0xb;
    if ((((uVar5 < 0x3f) && ((0x400000002000003bU >> ((ulong)uVar5 & 0x3f) & 1) != 0)) ||
        (pSVar2[uVar4].op == 6)) && (uVar3 == pSVar2[uVar4]._arg0)) {
      pSVar2[uVar4]._arg0 = 0xff;
    }
  }
  return;
}

Assistant:

void SQFuncState::DiscardTarget()
{
    SQInteger discardedtarget = PopTarget();
    SQInteger size = _instructions.size();
    if(size > 0 && _optimization){
        SQInstruction &pi = _instructions[size-1];//previous instruction
        switch(pi.op) {
        case _OP_SETI:case _OP_SETK:case _OP_SET:case _OP_NEWSLOTK:case _OP_NEWSLOT:case _OP_SETOUTER:case _OP_CALL:case _OP_NULLCALL:
            if(pi._arg0 == discardedtarget) {
                pi._arg0 = 0xFF;
            }
        }
    }
}